

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxPlusSolverForBGs.cpp
# Opt level: O1

void __thiscall
MaxPlusSolverForBGs::MaxPlusSolverForBGs
          (MaxPlusSolverForBGs *this,size_t maxiter,string *updateType,int verbosity,double damping,
          size_t nrSolutions,size_t nrRestarts)

{
  pointer pcVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (updateType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + updateType->_M_string_length);
  MaxPlusSolver::MaxPlusSolver
            (&this->super_MaxPlusSolver,maxiter,&local_50,verbosity,damping,nrSolutions,nrRestarts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

MaxPlusSolverForBGs::MaxPlusSolverForBGs(
        size_t maxiter,
        string updateType,
        int verbosity,
        double damping,
        size_t nrSolutions,
        size_t nrRestarts)
    :
    MaxPlusSolver(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
{
}